

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void EVdfg_add_act_to_queue(EVdfg_configuration state,EVdfg_config_action act)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long in_RDI;
  size_t in_stack_ffffffffffffffe8;
  int *ptr;
  
  ptr = (int *)&stack0x00000008;
  if (*(long *)(in_RDI + 0x18) == 0) {
    *(undefined4 *)(in_RDI + 0x10) = 0;
    pvVar2 = INT_CMmalloc((size_t)ptr);
    *(void **)(in_RDI + 0x18) = pvVar2;
    iVar1 = *(int *)(in_RDI + 0x10);
    *(int *)(in_RDI + 0x10) = iVar1 + 1;
    puVar3 = (undefined8 *)(*(long *)(in_RDI + 0x18) + (long)iVar1 * 0x20);
    *puVar3 = *(undefined8 *)ptr;
    puVar3[1] = *(undefined8 *)(ptr + 2);
    puVar3[2] = *(undefined8 *)(ptr + 4);
    puVar3[3] = *(undefined8 *)(ptr + 6);
  }
  else {
    pvVar2 = INT_CMrealloc(ptr,in_stack_ffffffffffffffe8);
    *(void **)(in_RDI + 0x18) = pvVar2;
    if (*ptr == 0xd) {
      memmove((void *)(*(long *)(in_RDI + 0x18) + 0x20),*(void **)(in_RDI + 0x18),
              (long)*(int *)(in_RDI + 0x10) << 5);
      puVar3 = *(undefined8 **)(in_RDI + 0x18);
      *puVar3 = *(undefined8 *)ptr;
      puVar3[1] = *(undefined8 *)(ptr + 2);
      puVar3[2] = *(undefined8 *)(ptr + 4);
      puVar3[3] = *(undefined8 *)(ptr + 6);
      *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
    }
    else {
      iVar1 = *(int *)(in_RDI + 0x10);
      *(int *)(in_RDI + 0x10) = iVar1 + 1;
      puVar3 = (undefined8 *)(*(long *)(in_RDI + 0x18) + (long)iVar1 * 0x20);
      *puVar3 = *(undefined8 *)ptr;
      puVar3[1] = *(undefined8 *)(ptr + 2);
      puVar3[2] = *(undefined8 *)(ptr + 4);
      puVar3[3] = *(undefined8 *)(ptr + 6);
    }
  }
  return;
}

Assistant:

static void
EVdfg_add_act_to_queue(EVdfg_configuration state, EVdfg_config_action act)
{
    if (state->pending_action_queue == NULL) {
	state->pending_action_count = 0;
	state->pending_action_queue = malloc(sizeof(state->pending_action_queue[0]));
	state->pending_action_queue[state->pending_action_count++] = act;
	return;
    }
    state->pending_action_queue = realloc(state->pending_action_queue, 
					  sizeof(state->pending_action_queue[0]) * (state->pending_action_count+1));
    if (act.type == ACT_create_bridge) {
	/* insert at beginning */
	memmove(&state->pending_action_queue[1], state->pending_action_queue, 
		sizeof(state->pending_action_queue[0]) * state->pending_action_count);
	state->pending_action_queue[0] = act;
	state->pending_action_count++;
    } else {
	state->pending_action_queue[state->pending_action_count++] = act;
    }
}